

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O0

void __thiscall cppcms::widgets::text::render_attributes(text *this,form_context *context)

{
  bool bVar1;
  ostream *poVar2;
  ostream *poVar3;
  pair<int,_int> pVar4;
  base_widget *in_RDI;
  form_context *unaff_retaddr;
  pair<int,_int> lm;
  ostream *output;
  base_text *in_stack_ffffffffffffffb8;
  ostream *in_stack_ffffffffffffffc0;
  form_context *in_stack_ffffffffffffffc8;
  
  base_widget::render_attributes(in_RDI,in_stack_ffffffffffffffc8);
  poVar2 = form_context::out(unaff_retaddr);
  if (-1 < *(int *)&(in_RDI->message_).id_.field_2) {
    std::operator<<(poVar2,"size=\"");
    impl::cint<int>(0x3f80bc);
    poVar3 = impl::details::operator<<
                       (in_stack_ffffffffffffffc0,
                        (write_int_to_stream<int> *)in_stack_ffffffffffffffb8);
    std::operator<<(poVar3,"\" ");
  }
  pVar4 = base_text::limits(in_stack_ffffffffffffffb8);
  if ((-1 < (long)pVar4) &&
     (bVar1 = base_text::validate_charset((base_text *)&(in_RDI->name_)._M_string_length), bVar1)) {
    poVar3 = std::operator<<(poVar2,"maxlength=\"");
    impl::cint<int>(0x3f812b);
    poVar3 = impl::details::operator<<(poVar3,(write_int_to_stream<int> *)in_stack_ffffffffffffffb8)
    ;
    std::operator<<(poVar3,"\" ");
  }
  bVar1 = base_widget::readonly
                    ((base_widget *)
                     ((in_RDI->super_base_form)._vptr_base_form[-3] +
                     (long)&(in_RDI->super_base_form)._vptr_base_form));
  if (bVar1) {
    std::operator<<(poVar2,"readonly=\"readonly\" ");
  }
  return;
}

Assistant:

void text::render_attributes(form_context &context)
{
	base_widget::render_attributes(context);

	std::ostream &output = context.out();
	if(size_ >= 0)
		output << "size=\"" << cint(size_) <<"\" ";
	std::pair<int,int> lm=limits();
	if(lm.second >= 0 && validate_charset()) {
		output << "maxlength=\"" << cint(lm.second) << "\" ";
	}
	if(readonly()) {
		output << "readonly=\"readonly\" ";
	}
}